

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *__dest;
  add_thousands_sep<wchar_t> thousands_sep;
  wchar_t *pwVar1;
  size_t __n;
  uint uStack_8c;
  wchar_t local_88 [26];
  
  __dest = *it;
  thousands_sep.sep_.size_ = 1;
  thousands_sep.sep_.data_ = (wchar_t *)(this + 0xc);
  thousands_sep._16_8_ = (ulong)uStack_8c << 0x20;
  pwVar1 = internal::
           format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (local_88,*(unsigned_long *)this,*(int *)(this + 8),thousands_sep);
  __n = (long)pwVar1 - (long)local_88;
  if (__n != 0) {
    memcpy(__dest,local_88,__n);
  }
  *it = (wchar_t *)((long)__dest + __n);
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }